

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O0

char32_t * __thiscall
cs::mapping<char32_t,_char32_t>::match(mapping<char32_t,_char32_t> *this,char32_t *k)

{
  bool bVar1;
  compile_error *this_00;
  mapped_type *pmVar2;
  string *in_stack_ffffffffffffff98;
  mapping<char32_t,_char32_t> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  map<char32_t,_char32_t,_std::less<char32_t>,_std::allocator<std::pair<const_char32_t,_char32_t>_>_>
  *in_stack_ffffffffffffffc0;
  allocator local_31;
  string local_30 [48];
  
  bVar1 = exist(in_stack_ffffffffffffffa0,(char32_t *)in_stack_ffffffffffffff98);
  if (!bVar1) {
    this_00 = (compile_error *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Undefined Mapping.",&local_31);
    compile_error::compile_error(this_00,in_stack_ffffffffffffff98);
    __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
  }
  pmVar2 = std::
           map<char32_t,_char32_t,_std::less<char32_t>,_std::allocator<std::pair<const_char32_t,_char32_t>_>_>
           ::at(in_stack_ffffffffffffffc0,
                (key_type_conflict1 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
  ;
  return pmVar2;
}

Assistant:

const T &match(const Key &k) const
		{
			if (!exist(k))
				throw compile_error("Undefined Mapping.");
			return mDat.at(k);
		}